

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O1

void camellia_feistel(uint32_t *x,uint32_t *k,uint32_t *z)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = *k ^ *x;
  uVar1 = k[1] ^ x[1];
  uVar2 = (uint)FSb[uVar1 & 0xff] |
          (uint)FSb4[uVar1 >> 8 & 0xff] << 8 |
          (uint)FSb3[uVar1 >> 0x10 & 0xff] << 0x10 | (uint)FSb2[uVar1 >> 0x18] << 0x18;
  uVar1 = (uVar2 << 8 | (uint)FSb2[uVar1 >> 0x18]) ^
          ((uint)FSb4[uVar3 & 0xff] |
          (uint)FSb3[uVar3 >> 8 & 0xff] << 8 |
          (uint)FSb2[uVar3 >> 0x10 & 0xff] << 0x10 | (uint)FSb[uVar3 >> 0x18] << 0x18);
  uVar2 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ uVar2;
  uVar1 = (uVar2 << 0x18 | uVar2 >> 8) ^ uVar1;
  *z = (uVar1 << 0x18 | uVar1 >> 8) ^ *z ^ uVar2;
  z[1] = z[1] ^ uVar1;
  return;
}

Assistant:

static void camellia_feistel( const uint32_t x[2], const uint32_t k[2],
                              uint32_t z[2])
{
    uint32_t I0, I1;
    I0 = x[0] ^ k[0];
    I1 = x[1] ^ k[1];

    I0 = ((uint32_t) SBOX1((I0 >> 24) & 0xFF) << 24) |
         ((uint32_t) SBOX2((I0 >> 16) & 0xFF) << 16) |
         ((uint32_t) SBOX3((I0 >>  8) & 0xFF) <<  8) |
         ((uint32_t) SBOX4((I0      ) & 0xFF)      );
    I1 = ((uint32_t) SBOX2((I1 >> 24) & 0xFF) << 24) |
         ((uint32_t) SBOX3((I1 >> 16) & 0xFF) << 16) |
         ((uint32_t) SBOX4((I1 >>  8) & 0xFF) <<  8) |
         ((uint32_t) SBOX1((I1      ) & 0xFF)      );

    I0 ^= (I1 << 8) | (I1 >> 24);
    I1 ^= (I0 << 16) | (I0 >> 16);
    I0 ^= (I1 >> 8) | (I1 << 24);
    I1 ^= (I0 >> 8) | (I0 << 24);

    z[0] ^= I1;
    z[1] ^= I0;
}